

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int CVmRun::apply_index(vm_val_t *result,vm_val_t *container_val,vm_val_t *index_val)

{
  CVmObject *pCVar1;
  vm_val_t *in_RDX;
  int *in_RSI;
  vm_val_t *in_RDI;
  vm_obj_id_t obj;
  int iVar2;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar3;
  int local_4;
  
  iVar2 = *in_RSI;
  if (iVar2 == 5) {
    uVar3 = in_RSI[2];
    pCVar1 = vm_objp(0);
    local_4 = (*pCVar1->_vptr_CVmObject[0x27])(pCVar1,in_RDI,(ulong)uVar3,in_RDX);
  }
  else if (iVar2 == 10) {
    get_const_ptr(0);
    CVmObjList::index_list(in_RDX,(char *)CONCAT44(in_stack_ffffffffffffffdc,iVar2),in_RDI);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmRun::apply_index(VMG_ vm_val_t *result,
                        const vm_val_t *container_val,
                        const vm_val_t *index_val)
{
    /* check the type of the value we're indexing */
    switch(container_val->typ)
    {
    case VM_LIST:
        /* list constant - use the static list indexing method */
        CVmObjList::index_list(
            vmg_ result, get_const_ptr(vmg_ container_val->val.ofs),
            index_val);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual indexing method */
        {
            vm_obj_id_t obj = container_val->val.obj;
            return vm_objp(vmg_ obj)->index_val_q(vmg_ result, obj, index_val);
        }

    default:
        /* other values cannot be indexed */
        return FALSE;
    }
}